

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O2

int coda_mem_cursor_get_array_dim(coda_cursor_conflict *cursor,int *num_dims,long *dim)

{
  uint uVar1;
  coda_dynamic_type_struct *pcVar2;
  coda_type *pcVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar2[1].backend == coda_backend_binary) {
    pcVar3 = pcVar2->definition;
    lVar4._0_4_ = pcVar3[1].type_class;
    lVar4._4_4_ = pcVar3[1].read_type;
    if (lVar4 < 0) {
      *num_dims = 1;
      *dim = *(long *)(pcVar2 + 2);
    }
    else {
      uVar1 = *(uint *)&pcVar3[1].name;
      *num_dims = uVar1;
      uVar7 = 0;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar7;
      }
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        dim[uVar7] = (long)(&pcVar3[1].description)[uVar7];
      }
    }
    return 0;
  }
  if (pcVar2[1].backend == 2) {
    iVar5 = coda_ascbin_cursor_get_array_dim(cursor,num_dims,dim);
    return iVar5;
  }
  __assert_fail("type->tag == tag_mem_array",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                ,0x19d,"int coda_mem_cursor_get_array_dim(const coda_cursor *, int *, long *)");
}

Assistant:

int coda_mem_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;
    coda_mem_array *array;

    if (type->tag == tag_mem_data)
    {
        return coda_ascbin_cursor_get_array_dim(cursor, num_dims, dim);
    }

    assert(type->tag == tag_mem_array);
    array = (coda_mem_array *)cursor->stack[cursor->n - 1].type;
    if (array->definition->num_elements >= 0)
    {
        int i;

        *num_dims = array->definition->num_dims;
        for (i = 0; i < array->definition->num_dims; i++)
        {
            dim[i] = array->definition->dim[i];
        }
    }
    else
    {
        *num_dims = 1;
        dim[0] = array->num_elements;
    }

    return 0;
}